

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void Bpgetrast(char *fn,float *bf,int sx,int sy,int r)

{
  ssize_t sVar1;
  byte local_31;
  int local_30;
  int iStack_2c;
  uchar c;
  int j;
  int i;
  int fd;
  int r_local;
  int sy_local;
  int sx_local;
  float *bf_local;
  char *fn_local;
  
  i = r;
  fd = sy;
  r_local = sx;
  _sy_local = bf;
  bf_local = (float *)fn;
  j = open(fn,0);
  if (j < 1) {
    error(6);
  }
  else {
    for (iStack_2c = 0; iStack_2c < fd; iStack_2c = iStack_2c + 1) {
      for (local_30 = 0; local_30 < r_local; local_30 = local_30 + 1) {
        sVar1 = read(j,&local_31,1);
        if (sVar1 != 1) {
          error(4);
        }
        _sy_local[i * iStack_2c + local_30] = (float)local_31;
      }
    }
  }
  close(j);
  return;
}

Assistant:

void Bpgetrast(fn,bf,sx,sy,r)
char *fn ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    for (i = 0 ; i < sy ; i++) {
      for (j = 0 ; j < sx ; j++) {
        if (read(fd,&c,sizeof(c)) != 1) {
          error(4) ;
        }
        bf[r*i + j] = (float)c ;
      }
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}